

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O3

void mserialize::detail::visit_variant<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *pcVar5;
  char cVar6;
  detail *this;
  string_view tag_00;
  string_view tags;
  string_view tags_00;
  
  uVar1 = (ulong)(tag._len != 0);
  this = (detail *)(tag._ptr + uVar1);
  lVar4 = tag._len - uVar1;
  pcVar5 = (char *)0x0;
  if (lVar4 != 0) {
    pcVar5 = (char *)(lVar4 - 1);
  }
  binlog::Range::throw_if_overflow(istream,1);
  cVar6 = *istream->_begin;
  istream->_begin = istream->_begin + 1;
  sVar3 = extraout_RDX;
  for (; cVar6 != '\0'; cVar6 = cVar6 + -1) {
    tags._len = sVar3;
    tags._ptr = pcVar5;
    pcVar2 = (char *)tag_first_size(this,tags);
    if (pcVar5 < pcVar2) {
      pcVar2 = pcVar5;
    }
    this = this + (long)pcVar2;
    pcVar5 = pcVar5 + -(long)pcVar2;
    sVar3 = extraout_RDX_00;
  }
  tags_00._len = sVar3;
  tags_00._ptr = pcVar5;
  sVar3 = tag_first_size(this,tags_00);
  if ((sVar3 == 1) && (*this == (detail)0x30)) {
    binlog::ToStringVisitor::visit(visitor);
    return;
  }
  tag_00._len = sVar3;
  tag_00._ptr = (char *)this;
  visit_impl<binlog::ToStringVisitor,binlog::Range>(full_tag,tag_00,visitor,istream,max_recursion);
  return;
}

Assistant:

void visit_variant(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop <
  tag.remove_suffix(1); // drop >

  std::uint8_t discriminator;
  mserialize::deserialize(discriminator, istream);

  std::uint8_t preceding_tag_count = discriminator;
  while (preceding_tag_count--) { tag_pop(tag); }

  const string_view option_tag = tag_pop(tag);

  const bool skip = visitor.visit(mserialize::Visitor::VariantBegin{discriminator, option_tag}, istream);
  if (skip) { return; }

  if (option_tag == "0")
  {
    visitor.visit(mserialize::Visitor::Null{});
  }
  else
  {
    visit_impl(full_tag, option_tag, visitor, istream, max_recursion);
  }

  visitor.visit(mserialize::Visitor::VariantEnd{});
}